

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestStartCommand::InitialPass
          (cmCTestStartCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  const_reference pvVar6;
  char *pcVar7;
  ostream *poVar8;
  int local_cec;
  undefined1 local_ce8 [4];
  int model;
  undefined1 local_cc8 [8];
  ostringstream e;
  string local_b48 [32];
  undefined1 local_b28 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_9b0 [8];
  cmGeneratedFileStream ofs;
  string startLogFile;
  undefined1 local_728 [8];
  ostringstream cmCTestLog_msg_2;
  char *track;
  undefined1 local_588 [8];
  ostringstream cmCTestLog_msg_1;
  string local_410 [32];
  undefined1 local_3f0 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_271;
  string local_270;
  undefined1 local_250 [8];
  string binaryDir;
  string local_228;
  undefined1 local_208 [8];
  string sourceDir;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  char *local_80;
  char *bld_dir;
  char *src_dir;
  char *smodel;
  size_t cnt;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestStartCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError((cmCommand *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    src_dir = (char *)0x0;
    bld_dir = (char *)0x0;
    local_80 = (char *)0x0;
    for (smodel = (char *)0x0; pcVar7 = smodel,
        pcVar5 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local), pcVar7 < pcVar5; smodel = smodel + 1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(size_type)smodel);
      bVar3 = std::operator==(pvVar6,"TRACK");
      if (bVar3) {
        pcVar7 = smodel + 1;
        smodel = pcVar7;
        pcVar5 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local);
        if (pcVar7 < pcVar5) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(size_type)smodel);
          bVar3 = std::operator==(pvVar6,"APPEND");
          if (!bVar3) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(size_type)smodel);
            bVar3 = std::operator==(pvVar6,"QUIET");
            if (!bVar3) {
              pcVar1 = (this->super_cmCTestCommand).CTest;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,(size_type)smodel);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmCTest::SetSpecificTrack(pcVar1,pcVar7);
              goto LAB_001d1b53;
            }
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"TRACK argument missing track name",&local_a1);
        cmCommand::SetError((cmCommand *)this,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        this_local._7_1_ = 0;
        goto LAB_001d2ade;
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(size_type)smodel);
      bVar3 = std::operator==(pvVar6,"APPEND");
      if (bVar3) {
        this->CreateNewTag = false;
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(size_type)smodel);
        bVar3 = std::operator==(pvVar6,"QUIET");
        if (bVar3) {
          this->Quiet = true;
        }
        else if (src_dir == (char *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local,(size_type)smodel);
          src_dir = (char *)std::__cxx11::string::c_str();
        }
        else if (bld_dir == (char *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local,(size_type)smodel);
          bld_dir = (char *)std::__cxx11::string::c_str();
        }
        else {
          if (local_80 != (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c8,"Too many arguments",&local_c9);
            cmCommand::SetError((cmCommand *)this,&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::allocator<char>::~allocator(&local_c9);
            this_local._7_1_ = 0;
            goto LAB_001d2ade;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local,(size_type)smodel);
          local_80 = (char *)std::__cxx11::string::c_str();
        }
      }
LAB_001d1b53:
    }
    if (bld_dir == (char *)0x0) {
      pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"CTEST_SOURCE_DIRECTORY",&local_f1);
      bld_dir = cmMakefile::GetDefinition(pcVar2,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    if (local_80 == (char *)0x0) {
      pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"CTEST_BINARY_DIRECTORY",&local_119);
      local_80 = cmMakefile::GetDefinition(pcVar2,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    pcVar7 = bld_dir;
    if (bld_dir == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,
                 "source directory not specified. Specify source directory as an argument or set CTEST_SOURCE_DIRECTORY"
                 ,&local_141);
      cmCommand::SetError((cmCommand *)this,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      this_local._7_1_ = 0;
    }
    else if (local_80 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,
                 "binary directory not specified. Specify binary directory as an argument or set CTEST_BINARY_DIRECTORY"
                 ,&local_169);
      cmCommand::SetError((cmCommand *)this,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      this_local._7_1_ = 0;
    }
    else if ((src_dir == (char *)0x0) && ((this->CreateNewTag & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,
                 "no test model specified and APPEND not specified. Specify either a test model or the APPEND argument"
                 ,&local_191);
      cmCommand::SetError((cmCommand *)this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      this_local._7_1_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,pcVar7,&local_1b9);
      cmsys::SystemTools::AddKeepPath(&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      pcVar7 = local_80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,pcVar7,
                 (allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::AddKeepPath(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
      cmCTest::EmptyCTestConfiguration((this->super_cmCTestCommand).CTest);
      pcVar7 = bld_dir;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,pcVar7,
                 (allocator<char> *)(binaryDir.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::CollapseFullPath((string *)local_208,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)(binaryDir.field_2._M_local_buf + 0xf));
      pcVar7 = local_80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar7,&local_271);
      cmsys::SystemTools::CollapseFullPath((string *)local_250,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      pcVar1 = (this->super_cmCTestCommand).CTest;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::SetCTestConfiguration(pcVar1,"SourceDirectory",pcVar7,(bool)(this->Quiet & 1));
      pcVar1 = (this->super_cmCTestCommand).CTest;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::SetCTestConfiguration(pcVar1,"BuildDirectory",pcVar7,(bool)(this->Quiet & 1));
      if (src_dir == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
        poVar8 = std::operator<<((ostream *)local_588,"Run dashboard with to-be-determined model");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        poVar8 = std::operator<<(poVar8,"   Source directory: ");
        poVar8 = std::operator<<(poVar8,bld_dir);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        poVar8 = std::operator<<(poVar8,"   Build directory: ");
        poVar8 = std::operator<<(poVar8,local_80);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                     ,0x72,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&track);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        poVar8 = std::operator<<((ostream *)local_3f0,"Run dashboard with model ");
        poVar8 = std::operator<<(poVar8,src_dir);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        poVar8 = std::operator<<(poVar8,"   Source directory: ");
        poVar8 = std::operator<<(poVar8,bld_dir);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        poVar8 = std::operator<<(poVar8,"   Build directory: ");
        poVar8 = std::operator<<(poVar8,local_80);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                     ,0x6a,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_410);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
      }
      pcVar7 = cmCTest::GetSpecificTrack((this->super_cmCTestCommand).CTest);
      if (pcVar7 != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
        poVar8 = std::operator<<((ostream *)local_728,"   Track: ");
        poVar8 = std::operator<<(poVar8,pcVar7);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                     ,0x77,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)(startLogFile.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ofs.field_0x240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                     "/Testing/Temporary/LastStart.log");
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_9b0,(string *)&ofs.field_0x240,false,None);
      bVar4 = std::ios::operator!((ios *)(local_9b0 + (long)*(_func_int **)((long)local_9b0 + -0x18)
                                         ));
      if ((bVar4 & 1) == 0) {
        bVar3 = InitialCheckout(this,(ostream *)local_9b0,(string *)local_208);
        if (bVar3) {
          bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_208);
          if (bVar3) {
            cmCTest::SetRunCurrentScript((this->super_cmCTestCommand).CTest,false);
            cmCTest::SetSuppressUpdatingCTestConfiguration((this->super_cmCTestCommand).CTest,true);
            if (src_dir == (char *)0x0) {
              local_cec = -1;
            }
            else {
              local_cec = cmCTest::GetTestModelFromString(src_dir);
            }
            cmCTest::SetTestModel((this->super_cmCTestCommand).CTest,local_cec);
            cmCTest::SetProduceXML((this->super_cmCTestCommand).CTest,true);
            this_local._7_1_ =
                 cmCTest::InitializeFromCommand((this->super_cmCTestCommand).CTest,this);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc8);
            poVar8 = std::operator<<((ostream *)local_cc8,"given source path\n");
            poVar8 = std::operator<<(poVar8,"  ");
            poVar8 = std::operator<<(poVar8,(string *)local_208);
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"which is not an existing directory.  ");
            std::operator<<(poVar8,"Set CTEST_CHECKOUT_COMMAND to a command line to create it.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError((cmCommand *)this,(string *)local_ce8);
            std::__cxx11::string::~string((string *)local_ce8);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc8);
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
        poVar8 = std::operator<<((ostream *)local_b28,"Cannot create log file: LastStart.log");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                     ,0x7f,pcVar7,false);
        std::__cxx11::string::~string(local_b48);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
        this_local._7_1_ = 0;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_9b0);
      std::__cxx11::string::~string((string *)&ofs.field_0x240);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::~string((string *)local_208);
    }
  }
LAB_001d2ade:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestStartCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  size_t cnt = 0;
  const char* smodel = nullptr;
  const char* src_dir = nullptr;
  const char* bld_dir = nullptr;

  while (cnt < args.size()) {
    if (args[cnt] == "TRACK") {
      cnt++;
      if (cnt >= args.size() || args[cnt] == "APPEND" ||
          args[cnt] == "QUIET") {
        this->SetError("TRACK argument missing track name");
        return false;
      }
      this->CTest->SetSpecificTrack(args[cnt].c_str());
      cnt++;
    } else if (args[cnt] == "APPEND") {
      cnt++;
      this->CreateNewTag = false;
    } else if (args[cnt] == "QUIET") {
      cnt++;
      this->Quiet = true;
    } else if (!smodel) {
      smodel = args[cnt].c_str();
      cnt++;
    } else if (!src_dir) {
      src_dir = args[cnt].c_str();
      cnt++;
    } else if (!bld_dir) {
      bld_dir = args[cnt].c_str();
      cnt++;
    } else {
      this->SetError("Too many arguments");
      return false;
    }
  }

  if (!src_dir) {
    src_dir = this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY");
  }
  if (!bld_dir) {
    bld_dir = this->Makefile->GetDefinition("CTEST_BINARY_DIRECTORY");
  }
  if (!src_dir) {
    this->SetError("source directory not specified. Specify source directory "
                   "as an argument or set CTEST_SOURCE_DIRECTORY");
    return false;
  }
  if (!bld_dir) {
    this->SetError("binary directory not specified. Specify binary directory "
                   "as an argument or set CTEST_BINARY_DIRECTORY");
    return false;
  }
  if (!smodel && this->CreateNewTag) {
    this->SetError("no test model specified and APPEND not specified. Specify "
                   "either a test model or the APPEND argument");
    return false;
  }

  cmSystemTools::AddKeepPath(src_dir);
  cmSystemTools::AddKeepPath(bld_dir);

  this->CTest->EmptyCTestConfiguration();

  std::string sourceDir = cmSystemTools::CollapseFullPath(src_dir);
  std::string binaryDir = cmSystemTools::CollapseFullPath(bld_dir);
  this->CTest->SetCTestConfiguration("SourceDirectory", sourceDir.c_str(),
                                     this->Quiet);
  this->CTest->SetCTestConfiguration("BuildDirectory", binaryDir.c_str(),
                                     this->Quiet);

  if (smodel) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with model "
                         << smodel << std::endl
                         << "   Source directory: " << src_dir << std::endl
                         << "   Build directory: " << bld_dir << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with "
                       "to-be-determined model"
                         << std::endl
                         << "   Source directory: " << src_dir << std::endl
                         << "   Build directory: " << bld_dir << std::endl,
                       this->Quiet);
  }
  const char* track = this->CTest->GetSpecificTrack();
  if (track) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Track: " << track << std::endl, this->Quiet);
  }

  // Log startup actions.
  std::string startLogFile = binaryDir + "/Testing/Temporary/LastStart.log";
  cmGeneratedFileStream ofs(startLogFile);
  if (!ofs) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: LastStart.log" << std::endl);
    return false;
  }

  // Make sure the source directory exists.
  if (!this->InitialCheckout(ofs, sourceDir)) {
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDir)) {
    std::ostringstream e;
    e << "given source path\n"
      << "  " << sourceDir << "\n"
      << "which is not an existing directory.  "
      << "Set CTEST_CHECKOUT_COMMAND to a command line to create it.";
    this->SetError(e.str());
    return false;
  }

  this->CTest->SetRunCurrentScript(false);
  this->CTest->SetSuppressUpdatingCTestConfiguration(true);
  int model;
  if (smodel) {
    model = cmCTest::GetTestModelFromString(smodel);
  } else {
    model = cmCTest::UNKNOWN;
  }
  this->CTest->SetTestModel(model);
  this->CTest->SetProduceXML(true);

  return this->CTest->InitializeFromCommand(this);
}